

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O1

Data * Data::divide(vector<Data_*,_std::allocator<Data_*>_> *dataPara)

{
  Data *pDVar1;
  pointer ppDVar2;
  long lVar3;
  Data *pDVar4;
  vector<Data_*,_std::allocator<Data_*>_> *__range1;
  pointer ppDVar5;
  
  pDVar1 = *(dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pDVar1 == (Data *)0x0) {
    pDVar4 = (Data *)0x0;
  }
  else {
    pDVar4 = (Data *)0x0;
    lVar3 = __dynamic_cast(pDVar1,&typeinfo,&Integer::typeinfo,0);
    if (lVar3 != 0) {
      pDVar4 = Integer::divide(dataPara);
    }
  }
  ppDVar2 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppDVar5 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppDVar5 != ppDVar2; ppDVar5 = ppDVar5 + 1) {
    pDVar1 = *ppDVar5;
    if ((pDVar1 != (Data *)0x0) && (pDVar1->cited == 0)) {
      (*pDVar1->_vptr_Data[1])();
    }
  }
  ppDVar5 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (ppDVar5 != (pointer)0x0) {
    operator_delete(ppDVar5);
  }
  operator_delete(dataPara);
  return pDVar4;
}

Assistant:

Data *Data::divide(std::vector<Data *> *dataPara) {
    Data *result = NULL;
    if ((dynamic_cast<Integer *>((*dataPara)[0])) != NULL) {
        result = Integer::divide(dataPara);
    }
    for (auto i: *dataPara) {
        Data::check(i);
    }
    delete dataPara;
    return result;
}